

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O0

void trim_headers(curl_slist *head)

{
  size_t n;
  bool bVar1;
  int local_34;
  int space;
  size_t colon;
  char *store;
  char *value;
  curl_slist *l;
  curl_slist *head_local;
  
  for (value = (char *)head; value != (char *)0x0; value = *(char **)(value + 8)) {
    n = strcspn(*(char **)value,":");
    Curl_strntolower(*(char **)value,*(char **)value,n);
    if (*(char *)(*(long *)value + n) != '\0') {
      colon = (size_t)((char *)(*(long *)value + n) + 1);
      store = (char *)colon;
      while( true ) {
        bVar1 = false;
        if ((*store != '\0') && (bVar1 = true, *store != ' ')) {
          bVar1 = *store == '\t';
        }
        if (!bVar1) break;
        store = store + 1;
      }
      while (*store != '\0') {
        local_34 = 0;
        while( true ) {
          bVar1 = false;
          if ((*store != '\0') && (bVar1 = true, *store != ' ')) {
            bVar1 = *store == '\t';
          }
          if (!bVar1) break;
          store = store + 1;
          local_34 = local_34 + 1;
        }
        if (local_34 == 0) {
          *(char *)colon = *store;
          colon = colon + 1;
          store = store + 1;
        }
        else if (*store != '\0') {
          *(undefined1 *)colon = 0x20;
          colon = colon + 1;
        }
      }
      *(undefined1 *)colon = 0;
    }
  }
  return;
}

Assistant:

static void trim_headers(struct curl_slist *head)
{
  struct curl_slist *l;
  for(l = head; l; l = l->next) {
    char *value; /* to read from */
    char *store;
    size_t colon = strcspn(l->data, ":");
    Curl_strntolower(l->data, l->data, colon);

    value = &l->data[colon];
    if(!*value)
      continue;
    ++value;
    store = value;

    /* skip leading whitespace */
    while(*value && ISBLANK(*value))
      value++;

    while(*value) {
      int space = 0;
      while(*value && ISBLANK(*value)) {
        value++;
        space++;
      }
      if(space) {
        /* replace any number of consecutive whitespace with a single space,
           unless at the end of the string, then nothing */
        if(*value)
          *store++ = ' ';
      }
      else
        *store++ = *value++;
    }
    *store = 0; /* null terminate */
  }
}